

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.h
# Opt level: O3

uint16_t __thiscall snmalloc::LocalEntropy::next_fresh_bits(LocalEntropy *this,size_t n)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = this->count;
  if (n < uVar3) {
    uVar2 = this->fresh_bits;
  }
  else {
    uVar2 = this->local_counter + 1;
    this->local_counter = uVar2;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      uVar2 = ((uVar2 & 0xfffffffff) * this->local_key ^ uVar2) >> 0x20 | uVar2 << 0x20;
      bVar1 = false;
    } while (bVar4);
    uVar3 = 0x40;
  }
  this->fresh_bits = uVar2 >> ((byte)n & 0x3f);
  this->count = uVar3 - n;
  return ~(ushort)(-1L << ((byte)n & 0x3f)) & (ushort)uVar2;
}

Assistant:

uint16_t next_fresh_bits(size_t n)
    {
      if (count <= n)
      {
        fresh_bits = get_next();
        count = 64;
      }
      uint16_t result = static_cast<uint16_t>(fresh_bits & bits::mask_bits(n));
      fresh_bits >>= n;
      count -= n;
      return result;
    }